

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

SUNErrCode SUNMatZero_Dense(SUNMatrix A)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *(long *)((long)A->content + 0x10);
  lVar2 = *(long *)((long)A->content + 0x18);
  for (lVar3 = 0; lVar3 < lVar2; lVar3 = lVar3 + 1) {
    *(undefined8 *)(lVar1 + lVar3 * 8) = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatZero_Dense(SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i;
  sunrealtype* Adata;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);

  /* Perform operation A_ij = 0 */
  Adata = SM_DATA_D(A);
  for (i = 0; i < SM_LDATA_D(A); i++) { Adata[i] = ZERO; }

  return SUN_SUCCESS;
}